

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetOwnAccessors
               (Var instance,PropertyId propertyId,Var *getter,Var *setter,
               ScriptContext *requestContext)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *pRVar3;
  uint uVar4;
  
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  uVar4 = 0;
  if (bVar1) {
    pRVar3 = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (pRVar3 != (RecyclableObject *)0x0) {
      iVar2 = (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x15])
                        (pRVar3,(ulong)(uint)propertyId,getter,setter,requestContext);
      uVar4 = (uint)(iVar2 != 0);
    }
  }
  return uVar4;
}

Assistant:

BOOL JavascriptOperators::GetOwnAccessors(Var instance, PropertyId propertyId, Var* getter, Var* setter, ScriptContext * requestContext)
    {
        BOOL result;
        if (TaggedNumber::Is(instance))
        {
            result = false;
        }
        else
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);
            result = object && object->GetAccessors(propertyId, getter, setter, requestContext);
        }
        return result;
    }